

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O0

void __thiscall
cab::cab(cab *this,weak_ptr<cab_session> *cab_session,cab_manager *cab_manager,id_type id,
        road_network *rnet)

{
  road_network *rnet_local;
  id_type id_local;
  cab_manager *cab_manager_local;
  weak_ptr<cab_session> *cab_session_local;
  cab *this_local;
  
  this->_id = id;
  this->_passengers = 0;
  this->_position = D;
  this->_costs = 0;
  this->_rnet = rnet;
  std::vector<node_type,_std::allocator<node_type>_>::vector(&this->_route);
  std::vector<request,_std::allocator<request>_>::vector(&this->_requests);
  std::weak_ptr<cab_session>::weak_ptr(&this->_cab_session,cab_session);
  this->_cab_manager = cab_manager;
  return;
}

Assistant:

cab::cab(std::weak_ptr<cab_session> cab_session, cab_manager& cab_manager, id_type id, road_network* rnet) :
    _cab_session(cab_session),
    _cab_manager(&cab_manager),
    _id(id),
    _costs(0),
    _rnet(rnet),
    _position(node_type::D)
{
}